

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringpiece.cc
# Opt level: O0

stringpiece_ssize_type __thiscall
google::protobuf::StringPiece::find_first_not_of(StringPiece *this,StringPiece s,size_type pos)

{
  size_type in_RCX;
  bool *in_RDX;
  char *in_RSI;
  StringPiece *in_RDI;
  stringpiece_ssize_type i;
  bool lookup [256];
  size_type local_140;
  StringPiece in_stack_fffffffffffffed8;
  stringpiece_ssize_type local_8;
  
  if (in_RDI->length_ < 1) {
    local_8 = -1;
  }
  else if ((long)in_RDX < 1) {
    local_8 = 0;
  }
  else if (in_RDX == (bool *)0x1) {
    local_8 = find_first_not_of(in_RDI,*in_RSI,in_RCX);
  }
  else {
    memset(&stack0xfffffffffffffed8,0,0x100);
    BuildLookupTable(in_stack_fffffffffffffed8,in_RDX);
    for (local_140 = in_RCX; (long)local_140 < in_RDI->length_; local_140 = local_140 + 1) {
      if (((&stack0xfffffffffffffed8)[(byte)in_RDI->ptr_[local_140]] & 1) == 0) {
        return local_140;
      }
    }
    local_8 = -1;
  }
  return local_8;
}

Assistant:

stringpiece_ssize_type StringPiece::find_first_not_of(StringPiece s,
                                                      size_type pos) const {
  if (length_ <= 0) return npos;
  if (s.length_ <= 0) return 0;
  // Avoid the cost of BuildLookupTable() for a single-character search.
  if (s.length_ == 1) return find_first_not_of(s.ptr_[0], pos);

  bool lookup[UCHAR_MAX + 1] = { false };
  BuildLookupTable(s, lookup);
  for (stringpiece_ssize_type i = pos; i < length_; ++i) {
    if (!lookup[static_cast<unsigned char>(ptr_[i])]) {
      return i;
    }
  }
  return npos;
}